

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlParserPrintFileInfo(void)

{
  int iVar1;
  int iVar2;
  xmlParserInputPtr val;
  int local_1c;
  int n_input;
  xmlParserInputPtr input;
  int mem_base;
  int test_ret;
  
  input._4_4_ = 0;
  for (local_1c = 0; local_1c < 1; local_1c = local_1c + 1) {
    iVar1 = xmlMemBlocks();
    val = gen_xmlParserInputPtr(local_1c,0);
    xmlParserPrintFileInfo(val);
    call_tests = call_tests + 1;
    des_xmlParserInputPtr(local_1c,val,0);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParserPrintFileInfo",(ulong)(uint)(iVar2 - iVar1));
      input._4_4_ = input._4_4_ + 1;
      printf(" %d");
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return input._4_4_;
}

Assistant:

static int
test_xmlParserPrintFileInfo(void) {
    int test_ret = 0;

    int mem_base;
    xmlParserInputPtr input; /* an xmlParserInputPtr input */
    int n_input;

    for (n_input = 0;n_input < gen_nb_xmlParserInputPtr;n_input++) {
        mem_base = xmlMemBlocks();
        input = gen_xmlParserInputPtr(n_input, 0);

        xmlParserPrintFileInfo(input);
        call_tests++;
        des_xmlParserInputPtr(n_input, input, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlParserPrintFileInfo",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_input);
            printf("\n");
        }
    }
    function_tests++;

    return(test_ret);
}